

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::GetRethrowLabel(TypeChecker *this,Index depth,Label **out_label)

{
  char cVar1;
  char cVar2;
  Result RVar3;
  pointer pLVar4;
  uint uVar5;
  pointer pLVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint __val;
  string __str;
  string candidates;
  long *local_78;
  uint local_70;
  long local_68 [2];
  Label **local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  RVar3 = GetLabel(this,depth,out_label);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  if ((*out_label)->label_type == Catch) {
    return (Result)Ok;
  }
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  pLVar4 = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar6 = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pLVar6 - (long)pLVar4;
  if (uVar7 != 0) {
    uVar8 = 0;
    local_58 = out_label;
    do {
      __val = (uint)uVar8;
      if (*(int *)((long)&pLVar4[~uVar8].label_type + uVar7) == 7) {
        if (local_48 != 0) {
          std::__cxx11::string::append((char *)&local_50);
        }
        cVar2 = '\x01';
        if (9 < __val) {
          cVar1 = '\x04';
          do {
            cVar2 = cVar1;
            uVar5 = (uint)uVar8;
            if (uVar5 < 100) {
              cVar2 = cVar2 + -2;
              goto LAB_001725f7;
            }
            if (uVar5 < 1000) {
              cVar2 = cVar2 + -1;
              goto LAB_001725f7;
            }
            if (uVar5 < 10000) goto LAB_001725f7;
            uVar8 = uVar8 / 10000;
            cVar1 = cVar2 + '\x04';
          } while (99999 < uVar5);
          cVar2 = cVar2 + '\x01';
        }
LAB_001725f7:
        local_78 = local_68;
        std::__cxx11::string::_M_construct((ulong)&local_78,cVar2);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,local_70,__val);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        pLVar4 = (this->label_stack_).
                 super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar6 = (this->label_stack_).
                 super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      out_label = local_58;
      uVar8 = (ulong)(__val + 1);
      uVar7 = (long)pLVar6 - (long)pLVar4;
      uVar9 = ((long)uVar7 >> 3) * -0x71c71c71c71c71c7;
    } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
    uVar7 = (ulong)depth;
    if (local_48 != 0) {
      PrintError(this,"invalid rethrow depth: %u (catches: %s)",uVar7,local_50);
      goto LAB_001726ab;
    }
  }
  PrintError(this,"rethrow not in try catch block",uVar7);
LAB_001726ab:
  *out_label = (Label *)0x0;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return (Result)Error;
}

Assistant:

Result TypeChecker::GetRethrowLabel(Index depth, Label** out_label) {
  if (Failed(GetLabel(depth, out_label))) {
    return Result::Error;
  }

  if ((*out_label)->label_type == LabelType::Catch) {
    return Result::Ok;
  }

  std::string candidates;
  for (Index idx = 0; idx < label_stack_.size(); idx++) {
    LabelType type = label_stack_[label_stack_.size() - idx - 1].label_type;
    if (type == LabelType::Catch) {
      if (!candidates.empty()) {
        candidates.append(", ");
      }
      candidates.append(std::to_string(idx));
    }
  }

  if (candidates.empty()) {
    PrintError("rethrow not in try catch block");
  } else {
    PrintError("invalid rethrow depth: %" PRIindex " (catches: %s)", depth,
               candidates.c_str());
  }
  *out_label = nullptr;
  return Result::Error;
}